

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void createAxesMesh(void)

{
  undefined8 in_RAX;
  u32 vbo;
  GLuint local_14;
  
  local_14 = (GLuint)((ulong)in_RAX >> 0x20);
  (*glad_debug_glGenVertexArrays)(1,&gpu::axesVao);
  (*glad_debug_glBindVertexArray)(gpu::axesVao);
  (*glad_debug_glGenBuffers)(1,&local_14);
  (*glad_debug_glBindBuffer)(0x8892,local_14);
  if (createAxesMesh()::verts == '\0') {
    createAxesMesh();
  }
  (*glad_debug_glBufferData)(0x8892,0x120,createAxesMesh::verts,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0x18,(void *)0x0);
  (*glad_debug_glEnableVertexAttribArray)(1);
  (*glad_debug_glVertexAttribPointer)(1,3,0x1406,'\0',0x18,(void *)0xc);
  return;
}

Assistant:

void createAxesMesh()
{
    glGenVertexArrays(1, &gpu::axesVao);
    glBindVertexArray(gpu::axesVao);
    u32 vbo;
    glGenBuffers(1, &vbo);
    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    const vec3 BG_COLOR3 = BG_COLOR;
    struct Vert { vec3 pos, color; };
    const float alpha = 0.4f;
    const vec3 RED1 = {1, 0, 0};
    const vec3 RED2 = glm::mix(BG_COLOR3, RED1, alpha);
    const vec3 GREEN1 = {0, 1, 0};
    const vec3 GREEN2 = glm::mix(BG_COLOR3, GREEN1, alpha);
    const vec3 BLUE1 = {0, 0, 1};
    const vec3 BLUE2 = glm::mix(BG_COLOR3, BLUE1, alpha);
    static const Vert verts[] = {
        // X
        {{-1, 0, 0}, RED2},
        {{ 0, 0, 0}, RED2},
        {{ 0, 0, 0}, RED1},
        {{+1, 0, 0}, RED1},
        // Y
        {{0, -1, 0}, GREEN2},
        {{0,  0, 0}, GREEN2},
        {{0,  0, 0}, GREEN1},
        {{0, +1, 0}, GREEN1},
        // Z
        {{0, 0, -1}, BLUE2},
        {{0, 0,  0}, BLUE2},
        {{0, 0,  0}, BLUE1},
        {{0, 0, +1}, BLUE1}
    };
    constexpr int stride = 6 * sizeof(float);
    glBufferData(GL_ARRAY_BUFFER, sizeof(verts), verts, GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, stride, nullptr);
    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, stride, (void*)(3*sizeof(float)));
}